

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O2

mFILE * mstdout(void)

{
  mFILE *pmVar1;
  mFILE *pmVar2;
  
  pmVar2 = m_channel_1;
  if (m_channel_1 == (mFILE *)0x0) {
    pmVar1 = mfcreate((char *)0x0,0);
    pmVar2 = (mFILE *)0x0;
    m_channel_1 = pmVar1;
    if (pmVar1 != (mFILE *)0x0) {
      pmVar1->fp = _stdout;
      pmVar1->mode = 2;
      pmVar2 = pmVar1;
    }
  }
  return pmVar2;
}

Assistant:

mFILE *mstdout(void) {
    if (m_channel[1])
	return m_channel[1];

    m_channel[1] = mfcreate(NULL, 0);
    if (NULL == m_channel[1]) return NULL;
    m_channel[1]->fp = stdout;
    m_channel[1]->mode = MF_WRITE;
    return m_channel[1];
}